

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O0

void Nf_ManCutMatchPrint(Nf_Man_t *p,int iObj,char *pStr,Nf_Mat_t *pM)

{
  int iVar1;
  uint uVar2;
  Mio_Cell2_t *pMVar3;
  int *piVar4;
  int *piVar5;
  char *pcVar6;
  float fVar7;
  int *pCut;
  int i;
  Mio_Cell2_t *pCell;
  Nf_Mat_t *pM_local;
  char *pStr_local;
  int iObj_local;
  Nf_Man_t *p_local;
  
  printf("%5d %s : ",(ulong)(uint)iObj,pStr);
  if ((*(uint *)pM >> 0x14 & 0x3ff) == 0) {
    printf("Unassigned\n");
  }
  else {
    pMVar3 = Nf_ManCell(p,*(uint *)pM & 0xfffff);
    piVar4 = Nf_ObjCutSet(p,iObj);
    piVar4 = Nf_CutFromHandle(piVar4,*(uint *)pM >> 0x14 & 0x3ff);
    fVar7 = Nf_Wrd2Flt(pM->D);
    printf("D =%6.2f  ",(double)fVar7);
    fVar7 = Nf_Wrd2Flt(pM->A);
    printf("A =%6.2f  ",(double)fVar7);
    printf("C = %d ",(ulong)(*(uint *)pM >> 0x1e & 1));
    printf("  ");
    printf("Cut = {");
    for (pCut._4_4_ = 0; pCut._4_4_ < (int)(*(uint *)&pMVar3->field_0x10 >> 0x1c);
        pCut._4_4_ = pCut._4_4_ + 1) {
      piVar5 = Nf_CutLeaves(piVar4);
      printf("%4d ",(ulong)(uint)piVar5[pCut._4_4_]);
    }
    for (; pCut._4_4_ < 6; pCut._4_4_ = pCut._4_4_ + 1) {
      printf("     ");
    }
    printf("}  ");
    printf("%10s ",pMVar3->pName);
    printf("%d  ",(ulong)(*(uint *)&pMVar3->field_0x10 >> 0x1c));
    printf("{");
    for (pCut._4_4_ = 0; pCut._4_4_ < (int)(*(uint *)&pMVar3->field_0x10 >> 0x1c);
        pCut._4_4_ = pCut._4_4_ + 1) {
      fVar7 = Nf_Wrd2Flt(pMVar3->Delays[pCut._4_4_]);
      printf("%6.2f ",(double)fVar7);
    }
    for (; pCut._4_4_ < 6; pCut._4_4_ = pCut._4_4_ + 1) {
      printf("       ");
    }
    printf(" } ");
    for (pCut._4_4_ = 0; pCut._4_4_ < (int)(*(uint *)&pMVar3->field_0x10 >> 0x1c);
        pCut._4_4_ = pCut._4_4_ + 1) {
      iVar1 = Nf_CfgCompl(pM->Cfg,pCut._4_4_);
      pcVar6 = " ";
      if (iVar1 != 0) {
        pcVar6 = "!";
      }
      uVar2 = Nf_CfgVar(pM->Cfg,pCut._4_4_);
      printf("%s%d ",pcVar6,(ulong)uVar2);
    }
    for (; pCut._4_4_ < 6; pCut._4_4_ = pCut._4_4_ + 1) {
      printf("  ");
    }
    Dau_DsdPrintFromTruth(&pMVar3->uTruth,*(uint *)&pMVar3->field_0x10 >> 0x1c);
  }
  return;
}

Assistant:

void Nf_ManCutMatchPrint( Nf_Man_t * p, int iObj, char * pStr, Nf_Mat_t * pM )
{
    Mio_Cell2_t * pCell;
    int i, * pCut;
    printf( "%5d %s : ", iObj, pStr );
    if ( pM->CutH == 0 )
    {
        printf( "Unassigned\n" );
        return;
    }
    pCell = Nf_ManCell( p, pM->Gate );
    pCut = Nf_CutFromHandle( Nf_ObjCutSet(p, iObj), pM->CutH );
    printf( "D =%6.2f  ", Nf_Wrd2Flt(pM->D) );
    printf( "A =%6.2f  ", Nf_Wrd2Flt(pM->A) );
    printf( "C = %d ", pM->fCompl );
//    printf( "B = %d ", pM->fBest );
    printf( "  " );
    printf( "Cut = {" );
    for ( i = 0; i < (int)pCell->nFanins; i++ )
        printf( "%4d ", Nf_CutLeaves(pCut)[i] );
    for ( ; i < 6; i++ )
        printf( "     " );
    printf( "}  " );
    printf( "%10s ", pCell->pName );
    printf( "%d  ", pCell->nFanins );
    printf( "{" );
    for ( i = 0; i < (int)pCell->nFanins; i++ )
        printf( "%6.2f ", Nf_Wrd2Flt(pCell->Delays[i]) );
    for ( ; i < 6; i++ )
        printf( "       " );
    printf( " } " );
    for ( i = 0; i < (int)pCell->nFanins; i++ )
        printf( "%s%d ", Nf_CfgCompl(pM->Cfg, i) ? "!":" ", Nf_CfgVar(pM->Cfg, i) );
    for ( ; i < 6; i++ )
        printf( "  " );
    Dau_DsdPrintFromTruth( &pCell->uTruth, pCell->nFanins );
}